

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertRGBA32ToUV_SSE2(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  uint in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong in_RDI;
  __m128i V1;
  __m128i U1;
  __m128i V0;
  __m128i U0;
  __m128i b;
  __m128i g;
  __m128i r;
  uint16_t *last_rgb;
  int max_width;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  int in_stack_fffffffffffffefc;
  uint8_t *in_stack_ffffffffffffff00;
  uint8_t *in_stack_ffffffffffffff08;
  uint16_t *in_stack_ffffffffffffff10;
  undefined8 local_e8;
  __m128i *in_stack_ffffffffffffff20;
  __m128i *in_stack_ffffffffffffff28;
  __m128i *in_stack_ffffffffffffff30;
  uint16_t *in_stack_ffffffffffffff38;
  undefined8 *local_90;
  undefined8 *local_88;
  ulong local_80;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  
  local_90 = in_RDX;
  local_88 = in_RSI;
  for (local_80 = in_RDI; local_80 < in_RDI + (long)(int)((in_ECX & 0xfffffff0) << 2) * 2;
      local_80 = local_80 + 0x80) {
    RGBA32PackedToPlanar_16b_SSE2
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    ConvertRGBToUV_SSE2((__m128i *)g[1],(__m128i *)g[0],(__m128i *)b[1],(__m128i *)b[0],
                        (__m128i *)U0[1]);
    RGBA32PackedToPlanar_16b_SSE2
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    ConvertRGBToUV_SSE2((__m128i *)g[1],(__m128i *)g[0],(__m128i *)b[1],(__m128i *)b[0],
                        (__m128i *)U0[1]);
    local_48 = (short)local_e8;
    sStack_46 = (short)((ulong)local_e8 >> 0x10);
    sStack_44 = (short)((ulong)local_e8 >> 0x20);
    sStack_42 = (short)((ulong)local_e8 >> 0x30);
    sStack_40 = (short)in_stack_ffffffffffffff20;
    sStack_3e = (short)((ulong)in_stack_ffffffffffffff20 >> 0x10);
    sStack_3c = (short)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    sStack_3a = (short)((ulong)in_stack_ffffffffffffff20 >> 0x30);
    local_58 = (short)local_108;
    sStack_56 = (short)((uint)local_108 >> 0x10);
    sStack_54 = (short)in_stack_fffffffffffffefc;
    sStack_52 = (short)((uint)in_stack_fffffffffffffefc >> 0x10);
    sStack_50 = (short)in_stack_ffffffffffffff00;
    sStack_4e = (short)((ulong)in_stack_ffffffffffffff00 >> 0x10);
    sStack_4c = (short)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    sStack_4a = (short)((ulong)in_stack_ffffffffffffff00 >> 0x30);
    *local_88 = CONCAT17((0 < sStack_3a) * (sStack_3a < 0x100) *
                         (char)((ulong)in_stack_ffffffffffffff20 >> 0x30) - (0xff < sStack_3a),
                         CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) *
                                  (char)((ulong)in_stack_ffffffffffffff20 >> 0x20) -
                                  (0xff < sStack_3c),
                                  CONCAT15((0 < sStack_3e) * (sStack_3e < 0x100) *
                                           (char)((ulong)in_stack_ffffffffffffff20 >> 0x10) -
                                           (0xff < sStack_3e),
                                           CONCAT14((0 < sStack_40) * (sStack_40 < 0x100) *
                                                    (char)in_stack_ffffffffffffff20 -
                                                    (0xff < sStack_40),
                                                    CONCAT13((0 < sStack_42) * (sStack_42 < 0x100) *
                                                             (char)((ulong)local_e8 >> 0x30) -
                                                             (0xff < sStack_42),
                                                             CONCAT12((0 < sStack_44) *
                                                                      (sStack_44 < 0x100) *
                                                                      (char)((ulong)local_e8 >> 0x20
                                                                            ) - (0xff < sStack_44),
                                                                      CONCAT11((0 < sStack_46) *
                                                                               (sStack_46 < 0x100) *
                                                                               (char)((ulong)
                                                  local_e8 >> 0x10) - (0xff < sStack_46),
                                                  (0 < local_48) * (local_48 < 0x100) *
                                                  (char)local_e8 - (0xff < local_48))))))));
    local_88[1] = CONCAT17((0 < sStack_4a) * (sStack_4a < 0x100) *
                           (char)((ulong)in_stack_ffffffffffffff00 >> 0x30) - (0xff < sStack_4a),
                           CONCAT16((0 < sStack_4c) * (sStack_4c < 0x100) *
                                    (char)((ulong)in_stack_ffffffffffffff00 >> 0x20) -
                                    (0xff < sStack_4c),
                                    CONCAT15((0 < sStack_4e) * (sStack_4e < 0x100) *
                                             (char)((ulong)in_stack_ffffffffffffff00 >> 0x10) -
                                             (0xff < sStack_4e),
                                             CONCAT14((0 < sStack_50) * (sStack_50 < 0x100) *
                                                      (char)in_stack_ffffffffffffff00 -
                                                      (0xff < sStack_50),
                                                      CONCAT13((0 < sStack_52) * (sStack_52 < 0x100)
                                                               * (char)((uint)
                                                  in_stack_fffffffffffffefc >> 0x10) -
                                                  (0xff < sStack_52),
                                                  CONCAT12((0 < sStack_54) * (sStack_54 < 0x100) *
                                                           (char)in_stack_fffffffffffffefc -
                                                           (0xff < sStack_54),
                                                           CONCAT11((0 < sStack_56) *
                                                                    (sStack_56 < 0x100) *
                                                                    (char)((uint)local_108 >> 0x10)
                                                                    - (0xff < sStack_56),
                                                                    (0 < local_58) *
                                                                    (local_58 < 0x100) *
                                                                    (char)local_108 -
                                                                    (0xff < local_58))))))));
    local_68 = (short)in_stack_ffffffffffffff08;
    sStack_66 = (short)((ulong)in_stack_ffffffffffffff08 >> 0x10);
    sStack_64 = (short)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    sStack_62 = (short)((ulong)in_stack_ffffffffffffff08 >> 0x30);
    sStack_60 = (short)in_stack_ffffffffffffff10;
    sStack_5e = (short)((ulong)in_stack_ffffffffffffff10 >> 0x10);
    sStack_5c = (short)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    sStack_5a = (short)((ulong)in_stack_ffffffffffffff10 >> 0x30);
    local_78 = (short)local_118;
    sStack_76 = (short)((ulong)local_118 >> 0x10);
    sStack_74 = (short)((ulong)local_118 >> 0x20);
    sStack_72 = (short)((ulong)local_118 >> 0x30);
    sStack_70 = (short)uStack_110;
    sStack_6e = (short)((ulong)uStack_110 >> 0x10);
    sStack_6c = (short)((ulong)uStack_110 >> 0x20);
    sStack_6a = (short)((ulong)uStack_110 >> 0x30);
    *local_90 = CONCAT17((0 < sStack_5a) * (sStack_5a < 0x100) *
                         (char)((ulong)in_stack_ffffffffffffff10 >> 0x30) - (0xff < sStack_5a),
                         CONCAT16((0 < sStack_5c) * (sStack_5c < 0x100) *
                                  (char)((ulong)in_stack_ffffffffffffff10 >> 0x20) -
                                  (0xff < sStack_5c),
                                  CONCAT15((0 < sStack_5e) * (sStack_5e < 0x100) *
                                           (char)((ulong)in_stack_ffffffffffffff10 >> 0x10) -
                                           (0xff < sStack_5e),
                                           CONCAT14((0 < sStack_60) * (sStack_60 < 0x100) *
                                                    (char)in_stack_ffffffffffffff10 -
                                                    (0xff < sStack_60),
                                                    CONCAT13((0 < sStack_62) * (sStack_62 < 0x100) *
                                                             (char)((ulong)in_stack_ffffffffffffff08
                                                                   >> 0x30) - (0xff < sStack_62),
                                                             CONCAT12((0 < sStack_64) *
                                                                      (sStack_64 < 0x100) *
                                                                      (char)((ulong)
                                                  in_stack_ffffffffffffff08 >> 0x20) -
                                                  (0xff < sStack_64),
                                                  CONCAT11((0 < sStack_66) * (sStack_66 < 0x100) *
                                                           (char)((ulong)in_stack_ffffffffffffff08
                                                                 >> 0x10) - (0xff < sStack_66),
                                                           (0 < local_68) * (local_68 < 0x100) *
                                                           (char)in_stack_ffffffffffffff08 -
                                                           (0xff < local_68))))))));
    local_90[1] = CONCAT17((0 < sStack_6a) * (sStack_6a < 0x100) * (char)((ulong)uStack_110 >> 0x30)
                           - (0xff < sStack_6a),
                           CONCAT16((0 < sStack_6c) * (sStack_6c < 0x100) *
                                    (char)((ulong)uStack_110 >> 0x20) - (0xff < sStack_6c),
                                    CONCAT15((0 < sStack_6e) * (sStack_6e < 0x100) *
                                             (char)((ulong)uStack_110 >> 0x10) - (0xff < sStack_6e),
                                             CONCAT14((0 < sStack_70) * (sStack_70 < 0x100) *
                                                      (char)uStack_110 - (0xff < sStack_70),
                                                      CONCAT13((0 < sStack_72) * (sStack_72 < 0x100)
                                                               * (char)((ulong)local_118 >> 0x30) -
                                                               (0xff < sStack_72),
                                                               CONCAT12((0 < sStack_74) *
                                                                        (sStack_74 < 0x100) *
                                                                        (char)((ulong)local_118 >>
                                                                              0x20) -
                                                                        (0xff < sStack_74),
                                                                        CONCAT11((0 < sStack_76) *
                                                                                 (sStack_76 < 0x100)
                                                                                 * (char)((ulong)
                                                  local_118 >> 0x10) - (0xff < sStack_76),
                                                  (0 < local_78) * (local_78 < 0x100) *
                                                  (char)local_118 - (0xff < local_78))))))));
    local_88 = local_88 + 2;
    local_90 = local_90 + 2;
  }
  if ((int)(in_ECX & 0xfffffff0) < (int)in_ECX) {
    WebPConvertRGBA32ToUV_C
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
  }
  return;
}

Assistant:

static void ConvertRGBA32ToUV_SSE2(const uint16_t* rgb,
                                   uint8_t* u, uint8_t* v, int width) {
  const int max_width = width & ~15;
  const uint16_t* const last_rgb = rgb + 4 * max_width;
  while (rgb < last_rgb) {
    __m128i r, g, b, U0, V0, U1, V1;
    RGBA32PackedToPlanar_16b_SSE2(rgb +  0, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U0, &V0);
    RGBA32PackedToPlanar_16b_SSE2(rgb + 32, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U1, &V1);
    STORE_16(_mm_packus_epi16(U0, U1), u);
    STORE_16(_mm_packus_epi16(V0, V1), v);
    u += 16;
    v += 16;
    rgb += 2 * 32;
  }
  if (max_width < width) {  // left-over
    WebPConvertRGBA32ToUV_C(rgb, u, v, width - max_width);
  }
}